

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_error.h
# Opt level: O2

void __thiscall cppcms::cppcms_error::~cppcms_error(cppcms_error *this)

{
  booster::runtime_error::~runtime_error(&this->super_runtime_error);
  operator_delete(this);
  return;
}

Assistant:

class CPPCMS_API cppcms_error : public booster::runtime_error {
	std::string strerror(int err);
public:
	///
	/// Create an object with error code err (errno) and a message \a error
	///
	cppcms_error(int err,std::string const &error);
	///
	/// Create an object with message \a error
	///
	cppcms_error(std::string const &error) : booster::runtime_error(error) {};
}